

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O2

double get_value(shared_ptr<SchemeObject> *p,string *error_msg)

{
  eval_error *this;
  double local_40;
  shared_ptr<SchemeFloat> pf;
  shared_ptr<SchemeInt> pi;
  
  std::dynamic_pointer_cast<SchemeInt,SchemeObject>((shared_ptr<SchemeObject> *)&pi);
  if (pi.super___shared_ptr<SchemeInt,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    std::dynamic_pointer_cast<SchemeFloat,SchemeObject>((shared_ptr<SchemeObject> *)&pf);
    if (pf.super___shared_ptr<SchemeFloat,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0
       ) {
      this = (eval_error *)__cxa_allocate_exception(0x10);
      eval_error::runtime_error(this,error_msg);
      __cxa_throw(this,&eval_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_40 = (pf.super___shared_ptr<SchemeFloat,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pf.super___shared_ptr<SchemeFloat,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    local_40 = (double)(pi.super___shared_ptr<SchemeInt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pi.super___shared_ptr<SchemeInt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return local_40;
}

Assistant:

static double get_value(std::shared_ptr<SchemeObject> p, const std::string &error_msg)
{
    auto pi = std::dynamic_pointer_cast<SchemeInt>(p);
    if(pi)
        return pi->value;
    auto pf = std::dynamic_pointer_cast<SchemeFloat>(p);
    if(pf)
        return pf->value;
    throw eval_error(error_msg);
}